

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglwindow.cpp
# Opt level: O0

void __thiscall QOpenGLWindowPrivate::~QOpenGLWindowPrivate(QOpenGLWindowPrivate *this)

{
  QPaintDeviceWindowPrivate *in_RDI;
  
  *(undefined ***)in_RDI = &PTR__QOpenGLWindowPrivate_00214448;
  QScopedPointer<QOffscreenSurface,_QScopedPointerDeleter<QOffscreenSurface>_>::~QScopedPointer
            ((QScopedPointer<QOffscreenSurface,_QScopedPointerDeleter<QOffscreenSurface>_> *)in_RDI)
  ;
  QOpenGLTextureBlitter::~QOpenGLTextureBlitter((QOpenGLTextureBlitter *)in_RDI);
  QScopedPointer<QOpenGLWindowPaintDevice,_QScopedPointerDeleter<QOpenGLWindowPaintDevice>_>::
  ~QScopedPointer((QScopedPointer<QOpenGLWindowPaintDevice,_QScopedPointerDeleter<QOpenGLWindowPaintDevice>_>
                   *)in_RDI);
  QScopedPointer<QOpenGLFramebufferObject,_QScopedPointerDeleter<QOpenGLFramebufferObject>_>::
  ~QScopedPointer((QScopedPointer<QOpenGLFramebufferObject,_QScopedPointerDeleter<QOpenGLFramebufferObject>_>
                   *)in_RDI);
  QScopedPointer<QOpenGLContext,_QScopedPointerDeleter<QOpenGLContext>_>::~QScopedPointer
            ((QScopedPointer<QOpenGLContext,_QScopedPointerDeleter<QOpenGLContext>_> *)in_RDI);
  QPaintDeviceWindowPrivate::~QPaintDeviceWindowPrivate(in_RDI);
  return;
}

Assistant:

QOpenGLWindowPrivate::~QOpenGLWindowPrivate()
{
}